

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_msl.cpp
# Opt level: O2

string * __thiscall
spirv_cross::CompilerMSL::to_struct_member
          (string *__return_storage_ptr__,CompilerMSL *this,SPIRType *type,uint32_t member_type_id,
          uint32_t index,string *qualifier)

{
  bool bVar1;
  uint32_t uVar2;
  ID id;
  BaseType BVar3;
  SPIRType *pSVar4;
  undefined7 extraout_var;
  SPIRType *pSVar5;
  CompilerError *this_00;
  char *pcVar6;
  char (*ts_2) [2];
  SPIRType *pSVar7;
  undefined4 in_stack_fffffffffffffc28;
  undefined4 uVar8;
  string decl_type;
  uint local_3ac;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_3a8;
  string array_type;
  char *overlapping_binding_tag;
  string pack_pfx;
  string local_310;
  string local_2f0;
  string base_type;
  undefined1 local_180 [192];
  uint *local_c0;
  size_t local_b8;
  size_t local_b0;
  uint local_a8 [8];
  undefined1 local_88 [28];
  TypeID local_6c;
  __buckets_ptr local_68;
  size_type local_60;
  undefined1 local_58 [16];
  float local_48;
  undefined1 local_40 [16];
  
  bVar1 = CompilerGLSL::member_is_remapped_physical_type(&this->super_CompilerGLSL,type,index);
  uVar2 = member_type_id;
  if (bVar1) {
    uVar2 = Compiler::get_extended_member_decoration
                      ((Compiler *)this,(type->super_IVariant).self.id,index,
                       SPIRVCrossDecorationPhysicalTypeID);
  }
  pSVar4 = Compiler::get<spirv_cross::SPIRType>((Compiler *)this,uVar2);
  pack_pfx._M_dataplus._M_p = (pointer)&pack_pfx.field_2;
  pack_pfx._M_string_length = 0;
  pack_pfx.field_2._M_local_buf[0] = '\0';
  bVar1 = Compiler::has_extended_member_decoration
                    ((Compiler *)this,(type->super_IVariant).self.id,index,
                     SPIRVCrossDecorationInterfaceOrigID);
  id.id = 0;
  if (bVar1) {
    id.id = Compiler::get_extended_member_decoration
                      ((Compiler *)this,(type->super_IVariant).self.id,index,
                       SPIRVCrossDecorationInterfaceOrigID);
  }
  bVar1 = Compiler::is_matrix((Compiler *)this,pSVar4);
  if (bVar1) {
    bVar1 = Compiler::has_member_decoration
                      ((Compiler *)this,(TypeID)(type->super_IVariant).self.id,index,
                       DecorationRowMajor);
    uVar8 = (undefined4)CONCAT71(extraout_var,bVar1);
  }
  else {
    uVar8 = 0;
  }
  local_180._32_8_ = local_180 + 0x38;
  local_180._0_8_ = &PTR__SPIRType_0039df88;
  local_180._8_8_ = 0x1800000000;
  local_180._16_4_ = Unknown;
  local_180._20_4_ = 0;
  local_180._24_4_ = 1;
  local_180._28_4_ = 1;
  local_180._40_8_ = 0;
  local_180._48_8_ = 8;
  local_180._88_8_ = local_180 + 0x70;
  local_180._96_8_ = 0;
  local_180._104_8_ = 8;
  local_180._120_4_ = 0;
  local_180[0x7c] = false;
  local_180[0x7d] = false;
  local_180._128_4_ = StorageClassGeneric;
  local_180._136_8_ = local_180 + 0xa0;
  local_180._144_8_ = 0;
  local_180._152_8_ = 8;
  local_c0 = local_a8;
  local_b8 = 0;
  local_b0 = 8;
  local_68 = (__buckets_ptr)(local_40 + 8);
  local_88._0_7_ = 0;
  local_88._7_4_ = 0;
  local_6c.id = 0;
  local_88._12_16_ = (undefined1  [16])0x0;
  local_60 = 1;
  local_58 = (undefined1  [16])0x0;
  local_48 = 1.0;
  local_40 = (undefined1  [16])0x0;
  bVar1 = Compiler::has_member_decoration
                    ((Compiler *)this,(TypeID)(type->super_IVariant).self.id,index,DecorationOffset)
  ;
  if (bVar1) {
LAB_001bf4cc:
    this->is_using_builtin_array = true;
  }
  else {
    bVar1 = Compiler::has_extended_member_decoration
                      ((Compiler *)this,(type->super_IVariant).self.id,index,
                       SPIRVCrossDecorationResourceIndexPrimary);
    if (bVar1) goto LAB_001bf4cc;
  }
  bVar1 = CompilerGLSL::member_is_packed_physical_type(&this->super_CompilerGLSL,type,index);
  pSVar7 = pSVar4;
  if (bVar1) {
    if (pSVar4->basetype == Struct) {
      this_00 = (CompilerError *)__cxa_allocate_exception(0x10);
      CompilerError::CompilerError(this_00,"Cannot emit a packed struct currently.");
      goto LAB_001bfc1a;
    }
    bVar1 = Compiler::is_matrix((Compiler *)this,pSVar4);
    if (bVar1) {
      uVar2 = pSVar4->vecsize;
      local_3ac = pSVar4->columns;
      ::std::__cxx11::string::assign((char *)&pack_pfx);
      if ((char)uVar8 != '\0') {
        local_3ac = pSVar4->vecsize;
        uVar2 = pSVar4->columns;
        ::std::__cxx11::string::assign((char *)&pack_pfx);
      }
      pcVar6 = "float";
      if (pSVar4->width == 0x10) {
        pcVar6 = "half";
      }
      ::std::__cxx11::string::string((string *)&base_type,pcVar6,(allocator *)&array_type);
      ::std::__cxx11::string::string((string *)&array_type,"typedef ",(allocator *)&decl_type);
      ::std::operator+(&local_3a8,"packed_",&base_type);
      ::std::__cxx11::to_string((string *)&overlapping_binding_tag,uVar2);
      ::std::operator+(&decl_type,&local_3a8,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &overlapping_binding_tag);
      ::std::__cxx11::string::append((string *)&array_type);
      ::std::__cxx11::string::~string((string *)&decl_type);
      ::std::__cxx11::string::~string((string *)&overlapping_binding_tag);
      ::std::__cxx11::string::~string((string *)&local_3a8);
      ::std::operator+(&decl_type," ",&pack_pfx);
      ::std::__cxx11::string::append((string *)&array_type);
      ::std::__cxx11::string::~string((string *)&decl_type);
      ::std::__cxx11::to_string(&local_2f0,pSVar4->columns);
      ::std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &overlapping_binding_tag,&base_type,&local_2f0);
      ::std::operator+(&local_3a8,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &overlapping_binding_tag,"x");
      ::std::__cxx11::to_string(&local_310,pSVar4->vecsize);
      ::std::operator+(&decl_type,&local_3a8,&local_310);
      ::std::__cxx11::string::append((string *)&array_type);
      ::std::__cxx11::string::~string((string *)&decl_type);
      ::std::__cxx11::string::~string((string *)&local_310);
      ::std::__cxx11::string::~string((string *)&local_3a8);
      ::std::__cxx11::string::~string((string *)&overlapping_binding_tag);
      ::std::__cxx11::string::~string((string *)&local_2f0);
      ::std::__cxx11::to_string((string *)&overlapping_binding_tag,local_3ac);
      ::std::operator+(&local_3a8,"[",
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &overlapping_binding_tag);
      ::std::operator+(&decl_type,&local_3a8,"]");
      ::std::__cxx11::string::append((string *)&array_type);
      ::std::__cxx11::string::~string((string *)&decl_type);
      ::std::__cxx11::string::~string((string *)&local_3a8);
      ::std::__cxx11::string::~string((string *)&overlapping_binding_tag);
      ::std::__cxx11::string::append((char *)&array_type);
      add_typedef_line(this,&array_type);
      ::std::__cxx11::string::~string((string *)&array_type);
      ::std::__cxx11::string::~string((string *)&base_type);
    }
    else {
      bVar1 = Compiler::is_scalar((Compiler *)this,pSVar4);
      if (!bVar1) {
        ::std::__cxx11::string::assign((char *)&pack_pfx);
      }
    }
  }
  else {
    bVar1 = Compiler::is_matrix((Compiler *)this,pSVar4);
    if (bVar1) {
      if ((this->msl_options).msl_version < 30000) {
        bVar1 = Compiler::has_extended_decoration
                          ((Compiler *)this,(type->super_IVariant).self.id,
                           SPIRVCrossDecorationWorkgroupStruct);
        if (bVar1) {
          ::std::__cxx11::string::assign((char *)&pack_pfx);
          add_spv_func_and_recompile(this,SPVFuncImplStorageMatrix);
          this->is_using_builtin_array = true;
        }
      }
      if ((char)uVar8 != '\0') {
        pSVar7 = (SPIRType *)local_180;
        SPIRType::operator=(pSVar7,pSVar4);
        uVar2 = (uint32_t)local_180._24_8_;
        local_180._24_4_ = SUB84(local_180._24_8_,4);
        local_180._28_4_ = uVar2;
      }
    }
  }
  BVar3 = pSVar4->basetype;
  if ((BVar3 == Image) && ((pSVar4->image).sampled == 2)) {
    BVar3 = Image;
    if (((this->msl_options).platform == iOS) &&
       ((int)(this->msl_options).argument_buffers_tier < 1)) {
      bVar1 = Compiler::has_decoration((Compiler *)this,id,DecorationNonWritable);
      if (!bVar1) {
        this_00 = (CompilerError *)__cxa_allocate_exception(0x10);
        CompilerError::CompilerError
                  (this_00,"Writable images are not allowed on Tier1 argument buffers on iOS.");
LAB_001bfc1a:
        __cxa_throw(this_00,&CompilerError::typeinfo,::std::runtime_error::~runtime_error);
      }
      BVar3 = pSVar4->basetype;
    }
  }
  array_type._M_dataplus._M_p = (pointer)&array_type.field_2;
  array_type._M_string_length = 0;
  array_type.field_2._M_local_buf[0] = '\0';
  if (BVar3 - Image < 3) goto LAB_001bf93d;
  decl_type._M_dataplus._M_p._0_4_ = 0x7fffffff;
  if ((this->stage_out_var_id).id == 0) {
LAB_001bf8bd:
    if ((this->stage_in_var_id).id != 0) {
      pSVar5 = get_stage_in_struct_type(this);
      if ((pSVar5->super_IVariant).self.id == (type->super_IVariant).self.id) {
        bVar1 = variable_storage_requires_stage_io(this,StorageClassInput);
        if (bVar1) goto LAB_001bf8e8;
      }
    }
  }
  else {
    pSVar5 = get_stage_out_struct_type(this);
    if (((pSVar5->super_IVariant).self.id != (type->super_IVariant).self.id) ||
       ((this->capture_output_to_buffer & 1U) != 0)) goto LAB_001bf8bd;
LAB_001bf8e8:
    bVar1 = Compiler::is_member_builtin((Compiler *)this,type,index,(BuiltIn *)&decl_type);
    if (bVar1) {
      this->is_using_builtin_array = true;
    }
  }
  (*(this->super_CompilerGLSL).super_Compiler._vptr_Compiler[0x26])
            (&base_type,this,pSVar4,(ulong)id.id);
  ::std::__cxx11::string::operator=((string *)&array_type,(string *)&base_type);
  ::std::__cxx11::string::~string((string *)&base_type);
LAB_001bf93d:
  if (id.id != 0) {
    bVar1 = Compiler::is_pointer((Compiler *)this,pSVar7);
    pSVar4 = pSVar7;
    if (bVar1) {
      pSVar4 = Compiler::get_pointee_type((Compiler *)this,pSVar7);
    }
    bVar1 = Compiler::is_array((Compiler *)this,pSVar4);
    if (bVar1) {
      uVar2 = get_resource_array_size(this,pSVar4,id.id);
      if (uVar2 == 0) {
        ::std::__cxx11::string::assign((char *)&array_type);
      }
    }
  }
  decl_type._M_dataplus._M_p = (pointer)&decl_type.field_2;
  decl_type._M_string_length = 0;
  decl_type.field_2._M_local_buf[0] = '\0';
  if (pSVar7->vecsize < 5) {
    type_to_glsl_abi_cxx11_(&base_type,this,pSVar7,id.id,true);
    ::std::__cxx11::string::operator=((string *)&decl_type,(string *)&base_type);
    ::std::__cxx11::string::~string((string *)&base_type);
  }
  else {
    pSVar4 = Compiler::get<spirv_cross::SPIRType>((Compiler *)this,member_type_id);
    SPIRType::SPIRType((SPIRType *)&base_type,pSVar4);
    bVar1 = Compiler::is_matrix((Compiler *)this,(SPIRType *)&base_type);
    if (((byte)uVar8 & bVar1) == 1) {
      base_type.field_2._8_4_ = base_type.field_2._12_4_;
    }
    base_type.field_2._12_4_ = 1;
    ts_2 = (char (*) [2])&DAT_00000001;
    type_to_glsl_abi_cxx11_(&local_3a8,this,(SPIRType *)&base_type,id.id,true);
    ::std::__cxx11::string::operator=((string *)&decl_type,(string *)&local_3a8);
    ::std::__cxx11::string::~string((string *)&local_3a8);
    if (pSVar7->columns < 2) {
      join<char_const(&)[17],std::__cxx11::string&,char_const(&)[2]>
                (&local_3a8,(spirv_cross *)"spvPaddedStd140<",(char (*) [17])&decl_type,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x2bfd80,ts_2)
      ;
    }
    else {
      join<char_const(&)[23],std::__cxx11::string&,char_const(&)[3],unsigned_int_const&,char_const(&)[2]>
                (&local_3a8,(spirv_cross *)"spvPaddedStd140Matrix<",(char (*) [23])&decl_type,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x2bed76,
                 (char (*) [3])&pSVar7->columns,(uint *)0x2bfd80,
                 (char (*) [2])CONCAT44(uVar8,in_stack_fffffffffffffc28));
    }
    ::std::__cxx11::string::operator=((string *)&decl_type,(string *)&local_3a8);
    ::std::__cxx11::string::~string((string *)&local_3a8);
    SPIRType::~SPIRType((SPIRType *)&base_type);
  }
  bVar1 = Compiler::has_extended_member_decoration
                    ((Compiler *)this,(type->super_IVariant).self.id,index,
                     SPIRVCrossDecorationOverlappingBinding);
  overlapping_binding_tag = "";
  if (bVar1) {
    overlapping_binding_tag = "// Overlapping binding: ";
  }
  CompilerGLSL::to_member_name_abi_cxx11_(&base_type,&this->super_CompilerGLSL,type,index);
  member_attribute_qualifier_abi_cxx11_(&local_3a8,this,type,index);
  join<char_const*&,std::__cxx11::string&,std::__cxx11::string&,char_const(&)[2],std::__cxx11::string_const&,std::__cxx11::string,std::__cxx11::string,std::__cxx11::string&,char_const(&)[2]>
            (__return_storage_ptr__,(spirv_cross *)&overlapping_binding_tag,(char **)&pack_pfx,
             &decl_type,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x2af68c,
             (char (*) [2])qualifier,&base_type,&local_3a8,&array_type,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x2cce52,
             (char (*) [2])CONCAT44(uVar8,in_stack_fffffffffffffc28));
  ::std::__cxx11::string::~string((string *)&local_3a8);
  ::std::__cxx11::string::~string((string *)&base_type);
  this->is_using_builtin_array = false;
  ::std::__cxx11::string::~string((string *)&decl_type);
  ::std::__cxx11::string::~string((string *)&array_type);
  SPIRType::~SPIRType((SPIRType *)local_180);
  ::std::__cxx11::string::~string((string *)&pack_pfx);
  return __return_storage_ptr__;
}

Assistant:

string CompilerMSL::to_struct_member(const SPIRType &type, uint32_t member_type_id, uint32_t index,
                                     const string &qualifier)
{
	uint32_t orig_member_type_id = member_type_id;
	if (member_is_remapped_physical_type(type, index))
		member_type_id = get_extended_member_decoration(type.self, index, SPIRVCrossDecorationPhysicalTypeID);
	auto &physical_type = get<SPIRType>(member_type_id);

	// If this member is packed, mark it as so.
	string pack_pfx;

	// Allow Metal to use the array<T> template to make arrays a value type
	uint32_t orig_id = 0;
	if (has_extended_member_decoration(type.self, index, SPIRVCrossDecorationInterfaceOrigID))
		orig_id = get_extended_member_decoration(type.self, index, SPIRVCrossDecorationInterfaceOrigID);

	bool row_major = false;
	if (is_matrix(physical_type))
		row_major = has_member_decoration(type.self, index, DecorationRowMajor);

	SPIRType row_major_physical_type { OpTypeMatrix };
	const SPIRType *declared_type = &physical_type;

	// If a struct is being declared with physical layout,
	// do not use array<T> wrappers.
	// This avoids a lot of complicated cases with packed vectors and matrices,
	// and generally we cannot copy full arrays in and out of buffers into Function
	// address space.
	// Array of resources should also be declared as builtin arrays.
	if (has_member_decoration(type.self, index, DecorationOffset))
		is_using_builtin_array = true;
	else if (has_extended_member_decoration(type.self, index, SPIRVCrossDecorationResourceIndexPrimary))
		is_using_builtin_array = true;

	if (member_is_packed_physical_type(type, index))
	{
		// If we're packing a matrix, output an appropriate typedef
		if (physical_type.basetype == SPIRType::Struct)
		{
			SPIRV_CROSS_THROW("Cannot emit a packed struct currently.");
		}
		else if (is_matrix(physical_type))
		{
			uint32_t rows = physical_type.vecsize;
			uint32_t cols = physical_type.columns;
			pack_pfx = "packed_";
			if (row_major)
			{
				// These are stored transposed.
				rows = physical_type.columns;
				cols = physical_type.vecsize;
				pack_pfx = "packed_rm_";
			}
			string base_type = physical_type.width == 16 ? "half" : "float";
			string td_line = "typedef ";
			td_line += "packed_" + base_type + to_string(rows);
			td_line += " " + pack_pfx;
			// Use the actual matrix size here.
			td_line += base_type + to_string(physical_type.columns) + "x" + to_string(physical_type.vecsize);
			td_line += "[" + to_string(cols) + "]";
			td_line += ";";
			add_typedef_line(td_line);
		}
		else if (!is_scalar(physical_type)) // scalar type is already packed.
			pack_pfx = "packed_";
	}
	else if (is_matrix(physical_type))
	{
		if (!msl_options.supports_msl_version(3, 0) &&
		    has_extended_decoration(type.self, SPIRVCrossDecorationWorkgroupStruct))
		{
			pack_pfx = "spvStorage_";
			add_spv_func_and_recompile(SPVFuncImplStorageMatrix);
			// The pack prefix causes problems with array<T> wrappers.
			is_using_builtin_array = true;
		}
		if (row_major)
		{
			// Need to declare type with flipped vecsize/columns.
			row_major_physical_type = physical_type;
			swap(row_major_physical_type.vecsize, row_major_physical_type.columns);
			declared_type = &row_major_physical_type;
		}
	}

	// iOS Tier 1 argument buffers do not support writable images.
	if (physical_type.basetype == SPIRType::Image &&
		physical_type.image.sampled == 2 &&
		msl_options.is_ios() &&
		msl_options.argument_buffers_tier <= Options::ArgumentBuffersTier::Tier1 &&
		!has_decoration(orig_id, DecorationNonWritable))
	{
		SPIRV_CROSS_THROW("Writable images are not allowed on Tier1 argument buffers on iOS.");
	}

	// Array information is baked into these types.
	string array_type;
	if (physical_type.basetype != SPIRType::Image && physical_type.basetype != SPIRType::Sampler &&
	    physical_type.basetype != SPIRType::SampledImage)
	{
		BuiltIn builtin = BuiltInMax;

		// Special handling. In [[stage_out]] or [[stage_in]] blocks,
		// we need flat arrays, but if we're somehow declaring gl_PerVertex for constant array reasons, we want
		// template array types to be declared.
		bool is_ib_in_out =
				((stage_out_var_id && get_stage_out_struct_type().self == type.self &&
				  variable_storage_requires_stage_io(StorageClassOutput)) ||
				 (stage_in_var_id && get_stage_in_struct_type().self == type.self &&
				  variable_storage_requires_stage_io(StorageClassInput)));
		if (is_ib_in_out && is_member_builtin(type, index, &builtin))
			is_using_builtin_array = true;
		array_type = type_to_array_glsl(physical_type, orig_id);
	}

	if (orig_id)
	{
		auto *data_type = declared_type;
		if (is_pointer(*data_type))
			data_type = &get_pointee_type(*data_type);

		if (is_array(*data_type) && get_resource_array_size(*data_type, orig_id) == 0)
		{
			// Hack for declaring unsized array of resources. Need to declare dummy sized array by value inline.
			// This can then be wrapped in spvDescriptorArray as usual.
			array_type = "[1] /* unsized array hack */";
		}
	}

	string decl_type;
	if (declared_type->vecsize > 4)
	{
		auto orig_type = get<SPIRType>(orig_member_type_id);
		if (is_matrix(orig_type) && row_major)
			swap(orig_type.vecsize, orig_type.columns);
		orig_type.columns = 1;
		decl_type = type_to_glsl(orig_type, orig_id, true);

		if (declared_type->columns > 1)
			decl_type = join("spvPaddedStd140Matrix<", decl_type, ", ", declared_type->columns, ">");
		else
			decl_type = join("spvPaddedStd140<", decl_type, ">");
	}
	else
		decl_type = type_to_glsl(*declared_type, orig_id, true);

	const char *overlapping_binding_tag =
			has_extended_member_decoration(type.self, index, SPIRVCrossDecorationOverlappingBinding) ?
			"// Overlapping binding: " : "";

	auto result = join(overlapping_binding_tag, pack_pfx, decl_type, " ", qualifier,
	                   to_member_name(type, index), member_attribute_qualifier(type, index), array_type, ";");

	is_using_builtin_array = false;
	return result;
}